

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O0

IModelVisualization * __thiscall
iDynTree::Visualizer::modelViz(Visualizer *this,string *instanceName)

{
  VisualizerPimpl *pVVar1;
  int iVar2;
  string *in_RSI;
  Visualizer *in_RDI;
  int idx;
  string *in_stack_ffffffffffffff98;
  string local_40 [56];
  DummyModelVisualization *local_8;
  
  std::__cxx11::string::string(local_40,in_RSI);
  iVar2 = getModelInstanceIndex(in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_40);
  if (iVar2 < 0) {
    pVVar1 = in_RDI->pimpl;
  }
  else {
    pVVar1 = in_RDI->pimpl;
  }
  local_8 = &pVVar1->m_invalidModelViz;
  return &local_8->super_IModelVisualization;
}

Assistant:

IModelVisualization& Visualizer::modelViz(const std::string& instanceName)
{
    int idx = getModelInstanceIndex(instanceName);
    if( idx < 0 )
    {
        return this->pimpl->m_invalidModelViz;
    }

#ifdef IDYNTREE_USES_IRRLICHT
    return *(this->pimpl->m_modelViz->at(idx));
#else
    return this->pimpl->m_invalidModelViz;
#endif
}